

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O2

int default_setup_cipher
              (quicly_crypto_engine_t *engine,quicly_conn_t *conn,size_t epoch,int is_enc,
              ptls_cipher_context_t **hp_ctx,ptls_aead_context_t **aead_ctx,
              ptls_aead_algorithm_t *aead,ptls_hash_algorithm_t *hash,void *secret)

{
  int iVar1;
  ptls_cipher_context_t *ppVar2;
  ptls_aead_context_t *ppVar3;
  int iVar4;
  ptls_iovec_t secret_00;
  uint8_t hpkey [32];
  
  if (hp_ctx == (ptls_cipher_context_t **)0x0) {
    *aead_ctx = (ptls_aead_context_t *)0x0;
LAB_001143de:
    ppVar3 = ptls_aead_new(aead,hash,is_enc,secret,"tls13 quic ");
    *aead_ctx = ppVar3;
    iVar1 = 0x201;
    iVar4 = 0;
    if (ppVar3 == (ptls_aead_context_t *)0x0) {
      iVar4 = 0x201;
    }
    if (ppVar3 != (ptls_aead_context_t *)0x0 || hp_ctx == (ptls_cipher_context_t **)0x0)
    goto LAB_00114427;
  }
  else {
    *hp_ctx = (ptls_cipher_context_t *)0x0;
    *aead_ctx = (ptls_aead_context_t *)0x0;
    secret_00.len = hash->digest_size;
    secret_00.base = (uint8_t *)secret;
    iVar1 = ptls_hkdf_expand_label
                      (hash,hpkey,aead->ctr_cipher->key_size,secret_00,"quic hp",
                       (ptls_iovec_t)ZEXT816(0),(char *)0x0);
    if (iVar1 == 0) {
      ppVar2 = ptls_cipher_new(aead->ctr_cipher,is_enc,hpkey);
      *hp_ctx = ppVar2;
      if (ppVar2 != (ptls_cipher_context_t *)0x0) goto LAB_001143de;
      iVar1 = 0x201;
    }
    if (*aead_ctx != (ptls_aead_context_t *)0x0) {
      ptls_aead_free(*aead_ctx);
      *aead_ctx = (ptls_aead_context_t *)0x0;
    }
  }
  iVar4 = iVar1;
  if (*hp_ctx != (ptls_cipher_context_t *)0x0) {
    ptls_cipher_free(*hp_ctx);
    *hp_ctx = (ptls_cipher_context_t *)0x0;
  }
LAB_00114427:
  (*ptls_clear_memory)(hpkey,0x20);
  return iVar4;
}

Assistant:

static int default_setup_cipher(quicly_crypto_engine_t *engine, quicly_conn_t *conn, size_t epoch, int is_enc,
                                ptls_cipher_context_t **hp_ctx, ptls_aead_context_t **aead_ctx, ptls_aead_algorithm_t *aead,
                                ptls_hash_algorithm_t *hash, const void *secret)
{
    uint8_t hpkey[PTLS_MAX_SECRET_SIZE];
    int ret;

    if (hp_ctx != NULL)
        *hp_ctx = NULL;
    *aead_ctx = NULL;

    /* generate new header protection key */
    if (hp_ctx != NULL) {
        if ((ret = ptls_hkdf_expand_label(hash, hpkey, aead->ctr_cipher->key_size, ptls_iovec_init(secret, hash->digest_size),
                                          "quic hp", ptls_iovec_init(NULL, 0), NULL)) != 0)
            goto Exit;
        if ((*hp_ctx = ptls_cipher_new(aead->ctr_cipher, is_enc, hpkey)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
    }

    /* generate new AEAD context */
    if ((*aead_ctx = ptls_aead_new(aead, hash, is_enc, secret, QUICLY_AEAD_BASE_LABEL)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (QUICLY_DEBUG) {
        char *secret_hex = quicly_hexdump(secret, hash->digest_size, SIZE_MAX),
             *hpkey_hex = quicly_hexdump(hpkey, aead->ctr_cipher->key_size, SIZE_MAX);
        fprintf(stderr, "%s:\n  aead-secret: %s\n  hp-key: %s\n", __FUNCTION__, secret_hex, hpkey_hex);
        free(secret_hex);
        free(hpkey_hex);
    }

    ret = 0;
Exit:
    if (ret != 0) {
        if (*aead_ctx != NULL) {
            ptls_aead_free(*aead_ctx);
            *aead_ctx = NULL;
        }
        if (hp_ctx != NULL && *hp_ctx != NULL) {
            ptls_cipher_free(*hp_ctx);
            *hp_ctx = NULL;
        }
    }
    ptls_clear_memory(hpkey, sizeof(hpkey));
    return ret;
}